

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalKdevelopGenerator::MergeProjectFiles
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string tmp;
  cmGeneratedFileStream fout;
  ifstream oldProjectFile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&oldProjectFile,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_oldProjectFile + -0x18)] & 5) == 0) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&oldProjectFile,&tmp,(bool *)0x0,-1), bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lines,&tmp);
    }
    std::ifstream::close();
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false,None);
    pbVar5 = lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      for (; pbVar5 != lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        pcVar4 = (pbVar5->_M_dataplus)._M_p;
        pcVar2 = strstr(pcVar4,"<projectdirectory>");
        if ((((pcVar2 == (char *)0x0) &&
             (pcVar2 = strstr(pcVar4,"<projectmanagement>"), pcVar2 == (char *)0x0)) &&
            (pcVar2 = strstr(pcVar4,"<absoluteprojectpath>"), pcVar2 == (char *)0x0)) &&
           (((pcVar2 = strstr(pcVar4,"<filelistdirectory>"), pcVar2 == (char *)0x0 &&
             (pcVar2 = strstr(pcVar4,"<buildtool>"), pcVar2 == (char *)0x0)) &&
            (pcVar2 = strstr(pcVar4,"<builddir>"), pcVar2 == (char *)0x0)))) {
          poVar3 = std::operator<<((ostream *)&fout,(string *)pbVar5);
          std::operator<<(poVar3,"\n");
          pcVar2 = strstr(pcVar4,"<general>");
          if (pcVar2 != (char *)0x0) {
            std::operator<<((ostream *)&fout,
                            "  <projectmanagement>KDevCustomProject</projectmanagement>\n");
            poVar3 = std::operator<<((ostream *)&fout,"  <projectdirectory>");
            poVar3 = std::operator<<(poVar3,(string *)projectDir);
            std::operator<<(poVar3,"</projectdirectory>\n");
            std::operator<<((ostream *)&fout,"  <absoluteprojectpath>true</absoluteprojectpath>\n");
          }
          pcVar2 = strstr(pcVar4,"<kdevcustomproject>");
          if (pcVar2 != (char *)0x0) {
            poVar3 = std::operator<<((ostream *)&fout,"    <filelistdirectory>");
            poVar3 = std::operator<<(poVar3,(string *)outputDir);
            std::operator<<(poVar3,"</filelistdirectory>\n");
          }
          pcVar4 = strstr(pcVar4,"<build>");
          if (pcVar4 != (char *)0x0) {
            std::operator<<((ostream *)&fout,"      <buildtool>make</buildtool>\n");
            poVar3 = std::operator<<((ostream *)&fout,"      <builddir>");
            poVar3 = std::operator<<(poVar3,(string *)outputDir);
            std::operator<<(poVar3,"</builddir>\n");
          }
        }
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lines);
    std::__cxx11::string::~string((string *)&tmp);
  }
  else {
    CreateNewProjectFile
              (this,outputDir,projectDir,filename,executable,cmakeFilePattern,fileToOpen,
               sessionFilename);
  }
  std::ifstream::~ifstream(&oldProjectFile);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::MergeProjectFiles(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmsys::ifstream oldProjectFile(filename.c_str());
  if (!oldProjectFile) {
    this->CreateNewProjectFile(outputDir, projectDir, filename, executable,
                               cmakeFilePattern, fileToOpen, sessionFilename);
    return;
  }

  /* Read the existing project file (line by line), copy all lines
    into the new project file, except the ones which can be reliably
    set from contents of the CMakeLists.txt */
  std::string tmp;
  std::vector<std::string> lines;
  while (cmSystemTools::GetLineFromStream(oldProjectFile, tmp)) {
    lines.push_back(tmp);
  }
  oldProjectFile.close();

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  for (std::vector<std::string>::const_iterator it = lines.begin();
       it != lines.end(); it++) {
    const char* line = (*it).c_str();
    // skip these tags as they are always replaced
    if ((strstr(line, "<projectdirectory>") != CM_NULLPTR) ||
        (strstr(line, "<projectmanagement>") != CM_NULLPTR) ||
        (strstr(line, "<absoluteprojectpath>") != CM_NULLPTR) ||
        (strstr(line, "<filelistdirectory>") != CM_NULLPTR) ||
        (strstr(line, "<buildtool>") != CM_NULLPTR) ||
        (strstr(line, "<builddir>") != CM_NULLPTR)) {
      continue;
    }

    // output the line from the file if it is not one of the above tags
    fout << *it << "\n";
    // if this is the <general> tag output the stuff that goes in the
    // general tag
    if (strstr(line, "<general>")) {
      fout << "  <projectmanagement>KDevCustomProject</projectmanagement>\n";
      fout << "  <projectdirectory>" << projectDir
           << "</projectdirectory>\n"; // this one is important
      fout << "  <absoluteprojectpath>true</absoluteprojectpath>\n";
      // and this one
    }
    // inside kdevcustomproject the <filelistdirectory> must be put
    if (strstr(line, "<kdevcustomproject>")) {
      fout << "    <filelistdirectory>" << outputDir
           << "</filelistdirectory>\n";
    }
    // buildtool and builddir go inside <build>
    if (strstr(line, "<build>")) {
      fout << "      <buildtool>make</buildtool>\n";
      fout << "      <builddir>" << outputDir << "</builddir>\n";
    }
  }
}